

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisRecordRepresentation0.cpp
# Opt level: O2

void __thiscall
DIS::GridAxisRecordRepresentation0::unmarshal
          (GridAxisRecordRepresentation0 *this,DataStream *dataStream)

{
  undefined1 *d;
  pointer puVar1;
  int idx;
  uint uVar2;
  uint8_t x;
  uchar local_29;
  
  GridAxisRecord::unmarshal(&this->super_GridAxisRecord,dataStream);
  d = &(this->super_GridAxisRecord).field_0xc;
  DataStream::operator>>(dataStream,(unsigned_short *)d);
  puVar1 = (this->_dataValues).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_dataValues).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->_dataValues).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  for (uVar2 = 0; uVar2 < *(ushort *)d; uVar2 = uVar2 + 1) {
    DataStream::operator>>(dataStream,&local_29);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->_dataValues,&local_29);
  }
  return;
}

Assistant:

void GridAxisRecordRepresentation0::unmarshal(DataStream &dataStream) {
  GridAxisRecord::unmarshal(
      dataStream); // unmarshal information in superclass first
  dataStream >> _numberOfBytes;

  _dataValues.clear();
  for (auto idx = 0; idx < _numberOfBytes; ++idx) {
    uint8_t x;
    dataStream >> x;
    _dataValues.push_back(x);
  }
}